

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

uint64 __thiscall
libebml::EbmlMaster::UpdateSize(EbmlMaster *this,bool bWithDefault,bool bForceRender)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  reference ppEVar5;
  uint64 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64 SizeToAdd;
  size_t Index;
  bool bForceRender_local;
  bool bWithDefault_local;
  EbmlMaster *this_local;
  
  EbmlElement::SetSize_(&this->super_EbmlElement,0);
  bVar1 = EbmlElement::IsFiniteSize(&this->super_EbmlElement);
  if (bVar1) {
    if ((!bForceRender) && (bVar1 = CheckMandatory(this), !bVar1)) {
      __assert_fail("CheckMandatory()",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                    ,0x8a,"virtual uint64 libebml::EbmlMaster::UpdateSize(bool, bool)");
    }
    for (SizeToAdd = 0;
        sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                          (&this->ElementList), SizeToAdd < sVar4; SizeToAdd = SizeToAdd + 1) {
      if (bWithDefault) {
LAB_001bbd04:
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,SizeToAdd);
        (*(*ppEVar5)->_vptr_EbmlElement[8])(*ppEVar5,(ulong)bWithDefault,(ulong)bForceRender & 1);
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,SizeToAdd);
        uVar6 = EbmlElement::ElementSize(*ppEVar5,bWithDefault);
        iVar3 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
        EbmlElement::SetSize_(&this->super_EbmlElement,CONCAT44(extraout_var,iVar3) + uVar6);
      }
      else {
        ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,SizeToAdd);
        uVar2 = (*(*ppEVar5)->_vptr_EbmlElement[0xf])();
        if ((uVar2 & 1) == 0) goto LAB_001bbd04;
      }
    }
    if ((this->bChecksumUsed & 1U) != 0) {
      iVar3 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      uVar6 = EbmlElement::ElementSize((EbmlElement *)&this->Checksum,false);
      EbmlElement::SetSize_(&this->super_EbmlElement,CONCAT44(extraout_var_00,iVar3) + uVar6);
    }
    iVar3 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    this_local = (EbmlMaster *)CONCAT44(extraout_var_01,iVar3);
  }
  else {
    this_local = (EbmlMaster *)0xffffffffffffffff;
  }
  return (uint64)this_local;
}

Assistant:

uint64 EbmlMaster::UpdateSize(bool bWithDefault, bool bForceRender)
{
  SetSize_(0);

  if (!IsFiniteSize())
    return (0-1);

  if (!bForceRender) {
    assert(CheckMandatory());
    }

  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (!bWithDefault && (ElementList[Index])->IsDefaultValue())
      continue;
    (ElementList[Index])->UpdateSize(bWithDefault, bForceRender);
    uint64 SizeToAdd = (ElementList[Index])->ElementSize(bWithDefault);
#if defined(LIBEBML_DEBUG)
    if (static_cast<int64>(SizeToAdd) == (0-1))
      return (0-1);
#endif // LIBEBML_DEBUG
    SetSize_(GetSize() + SizeToAdd);
  }
  if (bChecksumUsed) {
    SetSize_(GetSize() + Checksum.ElementSize());
  }

  return GetSize();
}